

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Stable_options>::insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Stable_options> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  int iVar1;
  Filtration_value FVar2;
  Filtration_value FVar3;
  long lVar4;
  Filtration_value *filt;
  long lVar5;
  int iVar6;
  ulong uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  long lVar9;
  undefined8 *puVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar12;
  
  FVar2 = filtration[1];
  if (FVar2 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    FVar3 = *filtration;
    if ((char)in_FS_OFFSET[-0x15] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    if (in_FS_OFFSET[-0x17] != in_FS_OFFSET[-0x18]) {
      in_FS_OFFSET[-0x17] = in_FS_OFFSET[-0x18];
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0xc0),in_FS_OFFSET[-0x17],FVar3,
               (long)FVar3 + (long)FVar2 * 4);
    lVar9 = in_FS_OFFSET[-0x18];
    lVar4 = in_FS_OFFSET[-0x17];
    if (lVar9 != lVar4) {
      uVar7 = lVar4 - lVar9 >> 2;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar9,lVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar9,lVar4);
    }
    _Var8 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x18],in_FS_OFFSET[-0x17]);
    if ((_Var8._M_current != (int *)in_FS_OFFSET[-0x17]) &&
       (lVar9 = (long)_Var8._M_current + (in_FS_OFFSET[-0x17] - in_FS_OFFSET[-0x17]),
       in_FS_OFFSET[-0x17] != lVar9)) {
      in_FS_OFFSET[-0x17] = lVar9;
    }
    _Var8._M_current = (int *)in_FS_OFFSET[-0x18];
    filt = (Filtration_value *)in_FS_OFFSET[-0x17];
    if ((Filtration_value *)_Var8._M_current != filt) {
      _Var11._M_current = _Var8._M_current;
      do {
        if (*_Var11._M_current == (int)Nsimplex[3]._M_len) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar10 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar10,&char_const*::typeinfo,0);
        }
        _Var11._M_current = _Var11._M_current + 4;
      } while ((Filtration_value *)_Var11._M_current != filt);
    }
    iVar6 = (int)((ulong)((long)filt - (long)_Var8._M_current) >> 2) + -1;
    iVar1 = (int)Nsimplex[8]._M_len;
    if (iVar6 < iVar1) {
      iVar6 = iVar1;
    }
    *(int *)&Nsimplex[8]._M_len = iVar6;
    pVar12 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (Nsimplex + 4),_Var8,filt);
    filtration = pVar12._8_8_;
  }
  pVar12._8_8_ = filtration;
  pVar12.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar12;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }